

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O2

string * bitmanip::detail::stringify_impl<unsigned_int>(string *__return_storage_ptr__,uint *t)

{
  std::__cxx11::to_string(__return_storage_ptr__,*t);
  return __return_storage_ptr__;
}

Assistant:

auto stringify_impl(const T &t)
{
    if constexpr (std::is_same_v<bool, T>) {
        return std::string{t ? "true" : "false"};
    }
    else if constexpr (std::is_same_v<T, std::nullptr_t>) {
        return std::string{"nullptr"};
    }
    else if constexpr (std::is_integral_v<T>) {
        return std::to_string(t);
    }
    else if constexpr (std::is_floating_point_v<T>) {
        return std::to_string(t);
    }
    else if constexpr (std::is_enum_v<T>) {
        return std::to_string(static_cast<std::underlying_type_t<T>>(t));
    }
    else if constexpr (std::is_same_v<std::string, T>) {
        return t;
    }
    else if constexpr (std::is_same_v<std::string_view, T>) {
        return std::string{t};
    }
    else if constexpr (std::is_same_v<const char *, const T>) {
        return std::string{t};
    }
    else if constexpr (std::is_pointer_v<T>) {
        return std::to_string(reinterpret_cast<std::uintptr_t>(t));
    }
    else if constexpr (detail::isStaticCastable<T, std::string>) {
        return static_cast<std::string>(t);
    }
}